

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O1

NondegeneracyCheckResult * __thiscall
slang::ast::AssertionExpr::checkNondegeneracy
          (NondegeneracyCheckResult *__return_storage_ptr__,AssertionExpr *this)

{
  NondegeneracyCheckResult *pNVar1;
  
  for (; ((SyntaxNode *)this)->kind == Clocking; this = *(AssertionExpr **)((long)this + 0x18)) {
  }
  pNVar1 = (NondegeneracyCheckResult *)
           (*(code *)(&DAT_004bbb7c +
                     *(int *)(&DAT_004bbb7c + (ulong)((SyntaxNode *)this)->kind * 4)))();
  return pNVar1;
}

Assistant:

AssertionExpr::NondegeneracyCheckResult AssertionExpr::checkNondegeneracy() const {
    NondegeneracyCheckVisitor visitor;
    return visit(visitor);
}